

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_attributes.cpp
# Opt level: O0

void __thiscall
ON_3dmObjectAttributes::SetHatchBoundaryVisible(ON_3dmObjectAttributes *this,bool on)

{
  bool bVar1;
  ON_3dmObjectAttributesPrivate *this_00;
  bool on_local;
  ON_3dmObjectAttributes *this_local;
  
  bVar1 = HatchBoundaryVisible(this);
  if (bVar1 != on) {
    if (this->m_private == (ON_3dmObjectAttributesPrivate *)0x0) {
      this_00 = (ON_3dmObjectAttributesPrivate *)operator_new(0x158);
      ON_3dmObjectAttributesPrivate::ON_3dmObjectAttributesPrivate(this_00,this);
      this->m_private = this_00;
    }
    this->m_private->m_hatch_boundary_visible = on;
  }
  return;
}

Assistant:

void ON_3dmObjectAttributes::SetHatchBoundaryVisible(bool on)
{
  if (HatchBoundaryVisible() == on)
    return;

  if (nullptr == m_private)
    m_private = new ON_3dmObjectAttributesPrivate(this);
  m_private->m_hatch_boundary_visible = on;
}